

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O3

int speex_resampler_process_int
              (SpeexResamplerState *st,uint channel_index,short *in,uint *in_len,short *out,
              uint *out_len)

{
  float fVar1;
  spx_word16_t *psVar2;
  SpeexResamplerState *st_00;
  short sVar3;
  int iVar4;
  short *psVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  double dVar11;
  uint ichunk;
  spx_word16_t *y;
  spx_word16_t ystack [1024];
  uint local_10a4;
  uint local_10a0;
  int local_109c;
  uint local_1098;
  uint local_1094;
  short *local_1090;
  uint local_1084;
  uint local_1080;
  uint local_107c;
  SpeexResamplerState *local_1078;
  ulong local_1070;
  spx_word16_t *local_1068;
  uint *local_1060;
  uint *local_1058;
  long local_1050;
  long local_1048;
  short *local_1040;
  spx_word16_t local_1038 [1026];
  
  local_1048 = (long)st->in_stride;
  local_109c = st->out_stride;
  local_107c = *in_len;
  uVar9 = st->mem_alloc_size * channel_index;
  psVar2 = st->mem;
  uVar7 = *out_len;
  st->out_stride = 1;
  local_1060 = in_len;
  local_1058 = out_len;
  if (uVar7 != 0 && local_107c != 0) {
    lVar8 = (long)local_109c;
    local_1084 = (st->mem_alloc_size - st->filt_len) + 1;
    local_1070 = (ulong)channel_index;
    local_1050 = local_1048 * 2;
    local_1098 = channel_index;
    local_1090 = out;
    local_1078 = st;
    do {
      st_00 = local_1078;
      local_1068 = local_1038;
      local_10a4 = local_1084;
      if (local_107c < local_1084) {
        local_10a4 = local_107c;
      }
      local_10a0 = 0x400;
      if (uVar7 < 0x400) {
        local_10a0 = uVar7;
      }
      local_1040 = in;
      if (local_1078->magic_samples[local_1070] == 0) {
        iVar4 = 0;
        local_1094 = uVar7;
LAB_001175c5:
        uVar6 = (ulong)local_10a4;
        if (in == (short *)0x0) {
          if (uVar6 != 0) {
            uVar7 = st_00->filt_len - 1;
            do {
              psVar2[(ulong)uVar9 + (ulong)uVar7] = 0.0;
              uVar7 = uVar7 + 1;
              uVar6 = uVar6 - 1;
            } while (uVar6 != 0);
          }
        }
        else if (uVar6 != 0) {
          uVar7 = st_00->filt_len - 1;
          do {
            psVar2[(ulong)uVar9 + (ulong)uVar7] = (float)(int)*in;
            uVar7 = uVar7 + 1;
            in = (short *)((long)in + local_1050);
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
        speex_resampler_process_native(st_00,local_1098,&local_10a4,local_1068,&local_10a0);
        local_1080 = local_10a0;
      }
      else {
        iVar4 = speex_resampler_magic(local_1078,local_1098,&local_1068,local_10a0);
        local_10a0 = local_10a0 - iVar4;
        local_1094 = uVar7 - iVar4;
        if (st_00->magic_samples[local_1070] == 0) goto LAB_001175c5;
        local_10a4 = 0;
        local_1080 = 0;
      }
      uVar10 = iVar4 + local_1080;
      if (uVar10 != 0) {
        uVar6 = 0;
        psVar5 = local_1090;
        do {
          fVar1 = local_1038[uVar6];
          sVar3 = -0x8000;
          if ((-32767.5 <= fVar1) && (sVar3 = 0x7fff, fVar1 <= 32766.5)) {
            dVar11 = floor((double)fVar1 + 0.5);
            sVar3 = (short)(int)dVar11;
          }
          *psVar5 = sVar3;
          uVar6 = uVar6 + 1;
          psVar5 = psVar5 + lVar8;
        } while (uVar10 != uVar6);
      }
      uVar7 = local_1094 - local_1080;
      in = local_1040;
      if (local_1040 != (short *)0x0) {
        in = local_1040 + local_10a4 * (int)local_1048;
      }
      local_107c = local_107c - local_10a4;
      st = local_1078;
    } while ((local_107c != 0) && (local_1090 = local_1090 + uVar10 * local_109c, uVar7 != 0));
  }
  st->out_stride = local_109c;
  *local_1060 = *local_1060 - local_107c;
  *local_1058 = *local_1058 - uVar7;
  return (int)(st->resampler_ptr == resampler_basic_zero);
}

Assistant:

EXPORT int speex_resampler_process_int(SpeexResamplerState *st, spx_uint32_t channel_index, const spx_int16_t *in, spx_uint32_t *in_len, spx_int16_t *out, spx_uint32_t *out_len)
#else
EXPORT int speex_resampler_process_float(SpeexResamplerState *st, spx_uint32_t channel_index, const float *in, spx_uint32_t *in_len, float *out, spx_uint32_t *out_len)
#endif
{
   int j;
   spx_uint32_t ilen = *in_len;
   spx_uint32_t olen = *out_len;
   spx_word16_t *x = st->mem + channel_index * st->mem_alloc_size;
   const int filt_offs = st->filt_len - 1;
   const spx_uint32_t xlen = st->mem_alloc_size - filt_offs;
   const int istride = st->in_stride;

   if (st->magic_samples[channel_index])
      olen -= speex_resampler_magic(st, channel_index, &out, olen);
   if (! st->magic_samples[channel_index]) {
      while (ilen && olen) {
        spx_uint32_t ichunk = (ilen > xlen) ? xlen : ilen;
        spx_uint32_t ochunk = olen;

        if (in) {
           for(j=0;j<ichunk;++j)
              x[j+filt_offs]=in[j*istride];
        } else {
          for(j=0;j<ichunk;++j)
            x[j+filt_offs]=0;
        }
        speex_resampler_process_native(st, channel_index, &ichunk, out, &ochunk);
        ilen -= ichunk;
        olen -= ochunk;
        out += ochunk * st->out_stride;
        if (in)
           in += ichunk * istride;
      }
   }
   *in_len -= ilen;
   *out_len -= olen;
   return st->resampler_ptr == resampler_basic_zero ? RESAMPLER_ERR_ALLOC_FAILED : RESAMPLER_ERR_SUCCESS;
}